

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::Diagnostic>::
emplaceRealloc<slang::ast::Symbol_const&,slang::DiagCode&,slang::SourceLocation&>
          (SmallVectorBase<slang::Diagnostic> *this,pointer pos,Symbol *args,DiagCode *args_1,
          SourceLocation *args_2)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pDVar3;
  Diagnostic *__result;
  Diagnostic *this_00;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  SourceLocation *args_local_2;
  DiagCode *args_local_1;
  Symbol *args_local;
  pointer pos_local;
  SmallVectorBase<slang::Diagnostic> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pDVar3 = begin(this);
  __result = (Diagnostic *)slang::detail::allocArray(capacity,0x70);
  this_00 = __result + ((long)pos - (long)pDVar3) / 0x70;
  Diagnostic::Diagnostic(this_00,args,*args_1,*args_2);
  pDVar3 = end(this);
  if (pos == pDVar3) {
    __first = begin(this);
    pDVar3 = end(this);
    std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>(__first,pDVar3,__result);
  }
  else {
    pDVar3 = begin(this);
    std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>(pDVar3,pos,__result);
    pDVar3 = end(this);
    std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>(pos,pDVar3,this_00 + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pDVar3);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}